

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O1

void __thiscall duckdb::UpdateLocalState::~UpdateLocalState(UpdateLocalState *this)

{
  _Head_base<0UL,_duckdb::TableUpdateState_*,_false> __ptr;
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> __ptr_00;
  pointer ppEVar1;
  
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__UpdateLocalState_024a0ab8;
  __ptr._M_head_impl =
       (this->update_state).
       super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
       .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (TableUpdateState *)0x0) {
    ::std::default_delete<duckdb::TableUpdateState>::operator()
              ((default_delete<duckdb::TableUpdateState> *)&this->update_state,__ptr._M_head_impl);
  }
  (this->update_state).
  super_unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableUpdateState_*,_std::default_delete<duckdb::TableUpdateState>_>
  .super__Head_base<0UL,_duckdb::TableUpdateState_*,_false>._M_head_impl = (TableUpdateState *)0x0;
  __ptr_00._M_head_impl =
       (this->delete_state).
       super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
       .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (TableDeleteState *)0x0) {
    ::std::default_delete<duckdb::TableDeleteState>::operator()
              ((default_delete<duckdb::TableDeleteState> *)&this->delete_state,__ptr_00._M_head_impl
              );
  }
  (this->delete_state).
  super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
  .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl = (TableDeleteState *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
  ::~vector(&(this->default_executor).states.
             super_vector<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionExecutorState,_std::default_delete<duckdb::ExpressionExecutorState>,_true>_>_>
           );
  ppEVar1 = (this->default_executor).expressions.
            super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
            super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1);
  }
  DataChunk::~DataChunk(&this->delete_chunk);
  DataChunk::~DataChunk(&this->mock_chunk);
  DataChunk::~DataChunk(&this->update_chunk);
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__LocalSinkState_0248f280;
  ::std::vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>::~vector
            (&(this->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
            );
  operator_delete(this);
  return;
}

Assistant:

UpdateLocalState(ClientContext &context, const vector<unique_ptr<Expression>> &expressions,
	                 const vector<LogicalType> &table_types, const vector<unique_ptr<Expression>> &bound_defaults,
	                 const vector<unique_ptr<BoundConstraint>> &bound_constraints)
	    : default_executor(context, bound_defaults), bound_constraints(bound_constraints) {

		// Initialize the update chunk.
		auto &allocator = Allocator::Get(context);
		vector<LogicalType> update_types;
		update_types.reserve(expressions.size());
		for (auto &expr : expressions) {
			update_types.push_back(expr->return_type);
		}
		update_chunk.Initialize(allocator, update_types);

		// Initialize the mock and delete chunk.
		mock_chunk.Initialize(allocator, table_types);
		delete_chunk.Initialize(allocator, table_types);
	}